

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall
QTreeWidgetItem::insertChildren(QTreeWidgetItem *this,int index,QList<QTreeWidgetItem_*> *children)

{
  QList<QTreeWidgetItem_*> *this_00;
  QTreeWidgetItem *pQVar1;
  bool bVar2;
  QTreeModel *__s;
  iterator iVar3;
  QTreeWidgetItem *pQVar4;
  ulong uVar5;
  QTreeWidgetItemPrivate *this_01;
  long in_FS_OFFSET;
  QArrayData *local_98;
  long lStack_90;
  ulong local_88;
  QArrayData *local_78;
  undefined8 uStack_70;
  qsizetype local_68;
  QTreeWidgetItem *local_58;
  undefined1 *puStack_50;
  QTreeWidgetItem *local_48;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  if (((-1 < index) && ((ulong)(uint)index <= (ulong)(this->children).d.size)) &&
     ((children->d).size != 0)) {
    if ((&this->view->super_QTreeView == (QTreeView *)0x0) ||
       (bVar2 = QTreeView::isSortingEnabled(&this->view->super_QTreeView), !bVar2)) {
      __s = treeModel(this,(QTreeWidget *)0x0);
      local_68 = 0;
      local_78 = (QArrayData *)0x0;
      uStack_70 = 0;
      local_88 = 0;
      local_98 = (QArrayData *)0x0;
      lStack_90 = 0;
      if ((children->d).size != 0) {
        this_00 = &this->children;
        uVar5 = 0;
        do {
          pQVar1 = (children->d).ptr[uVar5];
          if ((pQVar1->view == (QTreeWidget *)0x0) && (pQVar1->par == (QTreeWidgetItem *)0x0)) {
            local_58 = pQVar1;
            QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                      ((QPodArrayOps<QTreeWidgetItem*> *)&local_98,local_88,&local_58);
            QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_98);
            pQVar4 = this;
            if (this->view == (QTreeWidget *)0x0 || __s == (QTreeModel *)0x0) {
              if (__s != (QTreeModel *)0x0) goto LAB_005b1824;
            }
            else {
              if ((int)(pQVar1->children).d.size == 0) {
                pQVar1->view = this->view;
              }
              else {
                local_58 = pQVar1;
                QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                          ((QPodArrayOps<QTreeWidgetItem*> *)&local_78,local_68,&local_58);
                QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_78);
              }
LAB_005b1824:
              if (__s->rootItem == this) {
                pQVar4 = (QTreeWidgetItem *)0x0;
              }
            }
            pQVar1->par = pQVar4;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)(children->d).size);
        if (local_88 != 0) {
          if (local_68 != 0) {
            do {
              iVar3 = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_78);
              pQVar1 = iVar3.i[-1];
              local_68 = local_68 + -1;
              pQVar1->view = this->view;
              if ((pQVar1->children).d.size != 0) {
                uVar5 = 0;
                do {
                  local_58 = (pQVar1->children).d.ptr[uVar5];
                  QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                            ((QPodArrayOps<QTreeWidgetItem*> *)&local_78,local_68,&local_58);
                  QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_78);
                  uVar5 = uVar5 + 1;
                } while (uVar5 < (ulong)(pQVar1->children).d.size);
              }
            } while (local_68 != 0);
          }
          if (__s != (QTreeModel *)0x0) {
            local_48 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
            local_58 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
            QTreeModel::index((QTreeModel *)&local_58,(char *)__s,(int)this);
            QAbstractItemModel::beginInsertRows
                      ((QModelIndex *)__s,(int)(QTreeModel *)&local_58,index);
          }
          if (local_88 != 0) {
            uVar5 = 0;
            do {
              pQVar1 = *(QTreeWidgetItem **)(lStack_90 + uVar5 * 8);
              local_58 = pQVar1;
              QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                        ((QPodArrayOps<QTreeWidgetItem*> *)this_00,(uint)index + uVar5,&local_58);
              this_01 = (QTreeWidgetItemPrivate *)this_00;
              QList<QTreeWidgetItem_*>::begin(this_00);
              if (pQVar1->par != (QTreeWidgetItem *)0x0) {
                QTreeWidgetItemPrivate::propagateDisabled(this_01,pQVar1);
              }
              QTreeWidgetItemPrivate::updateHiddenStatus(this_01,pQVar1,true);
              uVar5 = uVar5 + 1;
            } while (uVar5 < local_88);
          }
          if (__s != (QTreeModel *)0x0) {
            QAbstractItemModel::endInsertRows();
          }
        }
      }
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,8,0x10);
        }
      }
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,8,0x10);
        }
      }
    }
    else if ((children->d).size != 0) {
      uVar5 = 0;
      do {
        insertChild(this,index,(children->d).ptr[uVar5]);
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(children->d).size);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::insertChildren(int index, const QList<QTreeWidgetItem*> &children)
{
    if (index < 0 || index > this->children.size() || children.isEmpty())
        return;

    if (view && view->isSortingEnabled()) {
        for (int n = 0; n < children.size(); ++n)
            insertChild(index, children.at(n));
        return;
    }
    QTreeModel *model = treeModel();
    QStack<QTreeWidgetItem*> stack;
    QList<QTreeWidgetItem*> itemsToInsert;
    for (int n = 0; n < children.size(); ++n) {
        QTreeWidgetItem *child = children.at(n);
        if (child->view || child->par)
            continue;
        itemsToInsert.append(child);
        if (view && model) {
            if (child->childCount() == 0)
                child->view = view;
            else
                stack.push(child);
        }
        if (model && (model->rootItem == this))
            child->par = nullptr;
        else
            child->par = this;
    }
    if (!itemsToInsert.isEmpty()) {
        while (!stack.isEmpty()) {
            QTreeWidgetItem *i = stack.pop();
            i->view = view;
            for (int c = 0; c < i->children.size(); ++c)
                stack.push(i->children.at(c));
        }
        if (model) model->beginInsertItems(this, index, itemsToInsert.size());
        for (int n = 0; n < itemsToInsert.size(); ++n) {
            QTreeWidgetItem *child = itemsToInsert.at(n);
            this->children.insert(index + n, child);
            if (child->par)
                d->propagateDisabled(child);
            d->updateHiddenStatus(child, true);
        }
        if (model) model->endInsertItems();
    }
}